

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_active)

{
  sunrealtype ***pppsVar1;
  sunrealtype ***pppsVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  iVar3 = -0x16;
  if ((MRIC != (MRIStepCoupling)0x0) &&
     (((pppsVar1 = MRIC->W, pppsVar1 != (sunrealtype ***)0x0 || (MRIC->G != (sunrealtype ***)0x0))
      && (nstages_active != (int *)0x0 && stage_map != (int *)0x0)))) {
    *nstages_active = 0;
    uVar8 = (ulong)(uint)MRIC->stages;
    if (MRIC->stages < 1) {
      iVar4 = 0;
    }
    else {
      pppsVar2 = MRIC->G;
      lVar6 = 0;
      iVar4 = 0;
      do {
        if ((pppsVar1 == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
          bVar5 = false;
        }
        else {
          dVar11 = 0.0;
          lVar10 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar9 = 0;
              do {
                dVar11 = dVar11 + ABS(pppsVar1[lVar10][uVar9][lVar6]);
                uVar9 = uVar9 + 1;
              } while ((uVar8 & 0xffffffff) != uVar9);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != MRIC->nmat);
          bVar5 = 2.220446049250313e-14 < dVar11;
        }
        if ((pppsVar2 == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
          bVar7 = false;
        }
        else {
          dVar11 = 0.0;
          lVar10 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar9 = 0;
              do {
                dVar11 = dVar11 + ABS(pppsVar2[lVar10][uVar9][lVar6]);
                uVar9 = uVar9 + 1;
              } while ((uVar8 & 0xffffffff) != uVar9);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != MRIC->nmat);
          bVar7 = 2.220446049250313e-14 < dVar11;
        }
        if ((bool)(bVar5 | bVar7)) {
          stage_map[lVar6] = iVar4;
          iVar4 = iVar4 + 1;
        }
        else {
          stage_map[lVar6] = -1;
        }
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)MRIC->stages;
      } while (lVar6 < (long)uVar8);
    }
    iVar3 = -0x16;
    if (0 < iVar4) {
      *nstages_active = iVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC, int* stage_map,
                                int* nstages_active)
{
  int i, j, k, idx;
  sunrealtype Wsum, Gsum;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) { return (ARK_ILL_INPUT); }
  if (!(MRIC->W) && !(MRIC->G)) { return (ARK_ILL_INPUT); }
  if (!stage_map || !nstages_active) { return (ARK_ILL_INPUT); }

  /* -------------------
   * Compute storage map
   * ------------------- */

  /* Number of stage RHS vectors active */
  *nstages_active = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++)
  {
    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i < MRIC->stages; i++)
        {
          Wsum += SUNRabs(MRIC->W[k][i][j]);
        }
      }
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i < MRIC->stages; i++)
        {
          Gsum += SUNRabs(MRIC->G[k][i][j]);
        }
      }
    }

    if (Wsum > tol || Gsum > tol)
    {
      stage_map[j] = idx;
      idx++;
    }
    else { stage_map[j] = -1; }
  }

  /* Check and set number of stage RHS vectors active */
  if (idx < 1) { return (ARK_ILL_INPUT); }

  *nstages_active = idx;

  return (ARK_SUCCESS);
}